

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorProto::~FileDescriptorProto(FileDescriptorProto *this)

{
  ~FileDescriptorProto(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

FileDescriptorProto::~FileDescriptorProto() {
  SharedDtor();
}